

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::parsing::TokenKind>::emplaceRealloc<slang::parsing::TokenKind_const&>
          (SmallVectorBase<slang::parsing::TokenKind> *this,pointer pos,TokenKind *args)

{
  pointer pTVar1;
  ulong uVar2;
  size_type sVar3;
  pointer __dest;
  size_t __n;
  pointer __src;
  pointer __dest_00;
  long lVar4;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar4 = (long)pos - (long)this->data_;
  __dest = (pointer)detail::allocArray(capacity,2);
  pTVar1 = (pointer)((long)__dest + lVar4);
  *(TokenKind *)((long)__dest + lVar4) = *args;
  __src = this->data_;
  sVar3 = this->len;
  if (__src + sVar3 == pos) {
    if (sVar3 == 0) goto LAB_0019bd1c;
    __n = sVar3 * 2;
    __dest_00 = __dest;
  }
  else {
    if (__src != pos) {
      memmove(__dest,__src,(long)pos - (long)__src);
    }
    __n = (long)this->data_ + (this->len * 2 - (long)pos);
    if (__n == 0) goto LAB_0019bd1c;
    __src = pos;
    __dest_00 = pTVar1 + 1;
  }
  memmove(__dest_00,__src,__n);
LAB_0019bd1c:
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __dest;
  return pTVar1;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}